

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

Maybe<capnp::schema::Value::Reader> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::annotationValue<capnp::schema::Node::Reader>
          (Maybe<capnp::schema::Value::Reader> *__return_storage_ptr__,CapnpcCppMain *this,
          Reader proto,uint64_t annotationId)

{
  WirePointer WVar1;
  StructReader *pSVar2;
  ElementCount index;
  bool bVar3;
  StructReader local_e8;
  ListReader local_b8;
  PointerReader local_88;
  StructReader local_60;
  
  local_e8.data = proto._reader.pointers + 2;
  if (proto._reader.pointerCount < 3) {
    local_e8.data = (WirePointer *)0x0;
  }
  if (proto._reader.pointerCount < 3) {
    proto._reader.segment._0_4_ = 0;
    proto._reader.segment._4_4_ = 0;
    proto._reader.capTable._0_4_ = 0;
    proto._reader.capTable._4_4_ = 0;
    proto._reader.nestingLimit = 0x7fffffff;
  }
  local_e8.segment._0_4_ = proto._reader.segment._0_4_;
  local_e8.segment._4_4_ = proto._reader.segment._4_4_;
  local_e8.capTable._0_4_ = proto._reader.capTable._0_4_;
  local_e8.capTable._4_4_ = proto._reader.capTable._4_4_;
  local_e8.pointers._0_4_ = proto._reader.nestingLimit;
  WVar1 = (WirePointer)
          _::PointerReader::getList
                    (&local_b8,(PointerReader *)&local_e8,INLINE_COMPOSITE,(word *)0x0);
  if (local_b8.elementCount != 0) {
    index = 0;
    do {
      _::ListReader::getStructElement(&local_e8,&local_b8,index);
      if (local_e8.dataSize < 0x40) {
        WVar1.offsetAndKind.value = 0;
        WVar1.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        WVar1 = *local_e8.data;
      }
      if (WVar1 == (WirePointer)this) {
        bVar3 = local_e8.pointerCount == 0;
        local_88.pointer = (WirePointer *)CONCAT44(local_e8.pointers._4_4_,(int)local_e8.pointers);
        if (bVar3) {
          local_88.pointer = (WirePointer *)0x0;
        }
        local_88.nestingLimit = 0x7fffffff;
        if (!bVar3) {
          local_88.nestingLimit = local_e8.nestingLimit;
        }
        local_88.segment._0_4_ = 0;
        local_88.segment._4_4_ = 0;
        local_88.capTable._0_4_ = 0;
        local_88.capTable._4_4_ = 0;
        if (!bVar3) {
          local_88.segment._0_4_ = local_e8.segment._0_4_;
          local_88.segment._4_4_ = local_e8.segment._4_4_;
          local_88.capTable._0_4_ = local_e8.capTable._0_4_;
          local_88.capTable._4_4_ = local_e8.capTable._4_4_;
        }
        pSVar2 = _::PointerReader::getStruct(&local_60,&local_88,(word *)0x0);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value._reader.segment = local_60.segment;
        (__return_storage_ptr__->ptr).field_1.value._reader.capTable = local_60.capTable;
        (__return_storage_ptr__->ptr).field_1.value._reader.data = local_60.data;
        (__return_storage_ptr__->ptr).field_1.value._reader.pointers = local_60.pointers;
        *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             local_60.dataSize;
        *(StructPointerCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x24) =
             local_60.pointerCount;
        *(undefined2 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x26) = local_60._38_2_;
        *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_60.nestingLimit;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x2c) = local_60._44_4_;
        return (Maybe<capnp::schema::Value::Reader> *)pSVar2;
      }
      index = index + 1;
    } while (local_b8.elementCount != index);
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return (Maybe<capnp::schema::Value::Reader> *)WVar1;
}

Assistant:

kj::Maybe<schema::Value::Reader> annotationValue(P proto, uint64_t annotationId) {
    for (auto annotation: proto.getAnnotations()) {
      if (annotation.getId() == annotationId) {
        return annotation.getValue();
      }
    }
    return nullptr;
  }